

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketutils.cpp
# Opt level: O2

bool myutils::check_connect(SOCKET sock,int timeout_second)

{
  int iVar1;
  long lVar2;
  long lVar3;
  fd_set *__exceptfds;
  ulong uVar4;
  timeval *in_R8;
  socklen_t len;
  int err;
  fd_set wset;
  fd_set rset;
  
  lVar2 = std::chrono::_V2::system_clock::now();
  __exceptfds = (fd_set *)((long)sock % 0x40 & 0xffffffff);
  uVar4 = 1L << ((byte)__exceptfds & 0x3f);
  while( true ) {
    do {
      lVar3 = std::chrono::_V2::system_clock::now();
      if (SBORROW8(lVar3 - lVar2,(long)timeout_second * 1000000000) ==
          (lVar3 - lVar2) + (long)timeout_second * -1000000000 < 0) {
        return false;
      }
      iVar1 = select(sock,(fd_set *)&rset,(fd_set *)&wset,__exceptfds,in_R8);
    } while (iVar1 + 1U < 2);
    if ((rset.fds_bits[sock / 0x40] & uVar4) != 0) break;
    if ((wset.fds_bits[sock / 0x40] & uVar4) != 0) {
      return true;
    }
  }
  err = 0;
  len = 4;
  iVar1 = getsockopt(sock,1,4,&err,&len);
  return iVar1 == 0 && err == 0;
}

Assistant:

bool check_connect(SOCKET sock, int timeout_second) //, fd_set* rset, fd_set* wset)
    {
        auto begin_time = system_clock::now();

        while (system_clock::now() - begin_time < seconds(timeout_second)) {
            SOCKET high_sock = sock;

            fd_set rset, wset;
            int r = select(high_sock, &rset, &wset);
            if (r == -1 || r == 0 || is_EWOURLDBLOCK(r)) {
                continue;
            }
            else if (FD_ISSET(sock, &rset)) {
                int err = 0;
                socklen_t len = sizeof(err);
                int ret = getsockopt(sock, SOL_SOCKET, SO_ERROR, (char *)&err, &len);
                if (ret != 0) err = 1;

                return err == 0;
            }
            else if (FD_ISSET(sock, &wset)) {
                return true;
            }
        }

        return false;
    }